

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::PointRenderCase::verifyWidePointPattern
          (PointRenderCase *this,Surface *viewport,
          vector<deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::GeneratedPoint,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::GeneratedPoint>_>
          *refPoints,ProjectedBBox *bbox,int *logFloodCounter)

{
  bool bVar1;
  size_type sVar2;
  const_reference refPoint_00;
  bool bVar3;
  float fVar4;
  float fVar5;
  GeneratedPoint *refPoint;
  int pointNdx;
  bool anyError;
  int *logFloodCounter_local;
  ProjectedBBox *bbox_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::GeneratedPoint,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::GeneratedPoint>_>
  *refPoints_local;
  Surface *viewport_local;
  PointRenderCase *this_local;
  
  bVar3 = false;
  refPoint._0_4_ = 0;
  do {
    sVar2 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::GeneratedPoint,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::GeneratedPoint>_>
            ::size(refPoints);
    if ((int)sVar2 <= (int)refPoint) {
      return bVar3;
    }
    refPoint_00 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::GeneratedPoint,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::GeneratedPoint>_>
                  ::operator[](refPoints,(long)(int)refPoint);
    fVar4 = tcu::Vector<float,_2>::x(&refPoint_00->center);
    fVar5 = tcu::Vector<float,_3>::x(&bbox->min);
    if (fVar4 < fVar5) {
LAB_02378b04:
      fVar4 = tcu::Vector<float,_2>::x(&refPoint_00->center);
      fVar5 = tcu::Vector<float,_3>::x(&bbox->min);
      if (fVar5 + (float)refPoint_00->size / 2.0 <= fVar4) {
        fVar4 = tcu::Vector<float,_2>::y(&refPoint_00->center);
        fVar5 = tcu::Vector<float,_3>::y(&bbox->min);
        if (fVar5 - (float)refPoint_00->size / 2.0 <= fVar4) {
          fVar4 = tcu::Vector<float,_2>::x(&refPoint_00->center);
          fVar5 = tcu::Vector<float,_3>::x(&bbox->max);
          if (fVar4 <= fVar5 + (float)refPoint_00->size / 2.0) {
            fVar4 = tcu::Vector<float,_2>::y(&refPoint_00->center);
            fVar5 = tcu::Vector<float,_3>::y(&bbox->max);
            if (fVar4 <= fVar5 - (float)refPoint_00->size / 2.0) {
              bVar1 = verifyWidePoint(this,viewport,refPoint_00,bbox,POINT_PARTIAL,logFloodCounter);
              bVar3 = bVar3 != false || ((bVar1 ^ 0xffU) & 1) != 0;
            }
          }
        }
      }
    }
    else {
      fVar4 = tcu::Vector<float,_2>::y(&refPoint_00->center);
      fVar5 = tcu::Vector<float,_3>::y(&bbox->min);
      if (fVar4 < fVar5) goto LAB_02378b04;
      fVar4 = tcu::Vector<float,_2>::x(&refPoint_00->center);
      fVar5 = tcu::Vector<float,_3>::x(&bbox->max);
      if (fVar5 < fVar4) goto LAB_02378b04;
      fVar4 = tcu::Vector<float,_2>::y(&refPoint_00->center);
      fVar5 = tcu::Vector<float,_3>::y(&bbox->max);
      if (fVar5 < fVar4) goto LAB_02378b04;
      bVar1 = verifyWidePoint(this,viewport,refPoint_00,bbox,POINT_FULL,logFloodCounter);
      bVar3 = bVar3 != false || ((bVar1 ^ 0xffU) & 1) != 0;
    }
    refPoint._0_4_ = (int)refPoint + 1;
  } while( true );
}

Assistant:

bool PointRenderCase::verifyWidePointPattern (const tcu::Surface& viewport, const std::vector<GeneratedPoint>& refPoints, const ProjectedBBox& bbox, int& logFloodCounter)
{
	bool anyError = false;

	// check that there is something near each sample
	for (int pointNdx = 0; pointNdx < (int)refPoints.size(); ++pointNdx)
	{
		const GeneratedPoint& refPoint = refPoints[pointNdx];

		if (refPoint.center.x() >= bbox.min.x() &&
			refPoint.center.y() >= bbox.min.y() &&
			refPoint.center.x() <= bbox.max.x() &&
			refPoint.center.y() <= bbox.max.y())
		{
			// point fully in the bounding box
			anyError |= !verifyWidePoint(viewport, refPoint, bbox, POINT_FULL, logFloodCounter);
		}
		else if (refPoint.center.x() >= bbox.min.x() + (float)refPoint.size / 2.0f &&
				 refPoint.center.y() >= bbox.min.y() - (float)refPoint.size / 2.0f &&
				 refPoint.center.x() <= bbox.max.x() + (float)refPoint.size / 2.0f &&
				 refPoint.center.y() <= bbox.max.y() - (float)refPoint.size / 2.0f)
		{
			// point leaks into bounding box
			anyError |= !verifyWidePoint(viewport, refPoint, bbox, POINT_PARTIAL, logFloodCounter);
		}
	}

	return anyError;
}